

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

OPJ_BOOL opj_bio_byteout(opj_bio_t *bio)

{
  OPJ_BYTE *pOVar1;
  OPJ_UINT32 OVar2;
  bool bVar3;
  opj_bio_t *bio_local;
  
  bio->buf = (bio->buf & 0xff) << 8;
  OVar2 = 8;
  if (bio->buf == 0xff00) {
    OVar2 = 7;
  }
  bio->ct = OVar2;
  bVar3 = bio->bp < bio->end;
  if (bVar3) {
    pOVar1 = bio->bp;
    bio->bp = pOVar1 + 1;
    *pOVar1 = (OPJ_BYTE)(bio->buf >> 8);
  }
  bio_local._4_4_ = (uint)bVar3;
  return bio_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_bio_byteout(opj_bio_t *bio)
{
    bio->buf = (bio->buf << 8) & 0xffff;
    bio->ct = bio->buf == 0xff00 ? 7 : 8;
    if ((OPJ_SIZE_T)bio->bp >= (OPJ_SIZE_T)bio->end) {
        return OPJ_FALSE;
    }
    *bio->bp++ = (OPJ_BYTE)(bio->buf >> 8);
    return OPJ_TRUE;
}